

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall
ImPool<ImGuiDockContextPruneNodeData>::Clear(ImPool<ImGuiDockContextPruneNodeData> *this)

{
  int *piVar1;
  ImGuiDockContextPruneNodeData *pIVar2;
  
  ImGuiStorage::Clear(&this->Map);
  pIVar2 = (this->Buf).Data;
  if (pIVar2 != (ImGuiDockContextPruneNodeData *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    (this->Buf).Data = (ImGuiDockContextPruneNodeData *)0x0;
  }
  this->FreeIdx = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = 0; }